

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcCreateCnf(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  iVar5 = Saig_ManBmcRunTerSim_rec(p,pObj,iFrame);
  auVar4 = _DAT_0094e250;
  if (iVar5 == 3) {
    p_00 = p->vVisited;
    iVar5 = p_00->nSize;
    if (0 < (long)iVar5) {
      pVVar7 = p_00->pArray;
      lVar8 = (long)iVar5 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar12 = auVar12 ^ _DAT_0094e250;
      auVar14 = _DAT_0094f530;
      auVar15 = _DAT_0094e240;
      do {
        auVar16 = auVar15 ^ auVar4;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                    iVar13 < auVar16._4_4_) & 1)) {
          *(undefined4 *)((long)&pVVar7->nSize + lVar8) = 0;
        }
        if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
            auVar16._12_4_ <= auVar12._12_4_) {
          *(undefined4 *)((long)&pVVar7[1].nSize + lVar8) = 0;
        }
        auVar16 = auVar14 ^ auVar4;
        iVar17 = auVar16._4_4_;
        if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
          *(undefined4 *)((long)&pVVar7[2].nSize + lVar8) = 0;
          *(undefined4 *)((long)&pVVar7[3].nSize + lVar8) = 0;
        }
        lVar11 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar11 + 4;
        lVar11 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar11 + 4;
        lVar8 = lVar8 + 0x40;
      } while ((ulong)(iVar5 + 3U >> 2) << 6 != lVar8);
    }
    p_00->nSize = 0;
    pVVar7 = Vec_WecPushLevel(p_00);
    Vec_IntPush(pVVar7,pObj->Id);
    iVar5 = iFrame;
    if (-1 < iFrame) {
      do {
        Aig_ManIncrementTravId(p->pAig);
        pVVar7 = Vec_WecPushLevel(p->vVisited);
        lVar8 = (long)p->vVisited->nSize;
        if (lVar8 < 2) goto LAB_0056fd34;
        pVVar1 = p->vVisited->pArray;
        if (0 < pVVar1[lVar8 + -2].nSize) {
          lVar11 = 0;
          do {
            pVVar2 = p->pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar6 = pVVar1[lVar8 + -2].pArray[lVar11];
              if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) goto LAB_0056fd15;
              pAVar10 = (Aig_Obj_t *)pVVar2->pArray[uVar6];
            }
            Saig_ManBmcCreateCnf_iter(p,pAVar10,iVar5,pVVar7);
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar1[lVar8 + -2].nSize);
        }
      } while ((pVVar7->nSize != 0) && (bVar3 = 0 < iVar5, iVar5 = iVar5 + -1, bVar3));
    }
    lVar8 = (long)p->vVisited->nSize;
    if (0 < lVar8) {
      do {
        if (p->vVisited->nSize < lVar8) {
LAB_0056fd34:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar11 = lVar8 + -1;
        pVVar7 = p->vVisited->pArray;
        if (0 < pVVar7[lVar11].nSize) {
          lVar9 = 0;
          do {
            pVVar2 = p->pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar6 = pVVar7[lVar11].pArray[lVar9];
              if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) {
LAB_0056fd15:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pAVar10 = (Aig_Obj_t *)pVVar2->pArray[uVar6];
            }
            Saig_ManBmcCreateCnf_rec(p,pAVar10,iFrame - (int)lVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 < pVVar7[lVar11].nSize);
        }
        bVar3 = 1 < lVar8;
        lVar8 = lVar11;
      } while (bVar3);
    }
    uVar6 = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (p->pSat2 == (solver_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        sat_solver_setnvars(p->pSat,p->nSatVars);
      }
      else {
        iVar5 = bmcg_sat_solver_varnum(p->pSat3);
        if (iVar5 < p->nSatVars) {
          do {
            bmcg_sat_solver_addvar(p->pSat3);
            iVar5 = iVar5 + 1;
          } while (iVar5 < p->nSatVars);
        }
      }
    }
    else {
      satoko_setnvars(p->pSat2,p->nSatVars);
    }
  }
  else {
    uVar6 = (uint)(iVar5 == 2);
  }
  return uVar6;
}

Assistant:

int Saig_ManBmcCreateCnf( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vVisit, * vVisit2;
    Aig_Obj_t * pTemp;
    int Lit, f, i;
    // perform ternary simulation
    int Value = Saig_ManBmcRunTerSim_rec( p, pObj, iFrame );
    if ( Value != SAIG_TER_UND )
        return (int)(Value == SAIG_TER_ONE);
    // construct CNF if value is ternary
//    Lit = Saig_ManBmcCreateCnf_rec( p, pObj, iFrame );
    Vec_WecClear( p->vVisited );
    vVisit = Vec_WecPushLevel( p->vVisited );
    Vec_IntPush( vVisit, Aig_ObjId(pObj) );
    for ( f = iFrame; f >= 0; f-- )
    {
        Aig_ManIncrementTravId( p->pAig );
        vVisit2 = Vec_WecPushLevel( p->vVisited );
        vVisit = Vec_WecEntry( p->vVisited, Vec_WecSize(p->vVisited)-2 );
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_iter( p, pTemp, f, vVisit2 );
        if ( Vec_IntSize(vVisit2) == 0 )
            break;
    }
    Vec_WecForEachLevelReverse( p->vVisited, vVisit, f )
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_rec( p, pTemp, iFrame-f );
    Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
    // extend the SAT solver
    if ( p->pSat2 )
        satoko_setnvars( p->pSat2, p->nSatVars );
    else if ( p->pSat3 )
    {
        for ( i = bmcg_sat_solver_varnum(p->pSat3); i < p->nSatVars; i++ )
            bmcg_sat_solver_addvar( p->pSat3 );
    }
    else
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return Lit;
}